

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<int>_>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadFuncSqrt<Fad<double>_>_>_>_> *pFVar5;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *pFVar6;
  Fad<double> *pFVar7;
  double *pdVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  pFVar5 = this->left_;
  pFVar6 = (pFVar5->fadexpr_).right_;
  pdVar8 = &(pFVar6->fadexpr_).expr_.defaultVal;
  if ((pFVar6->fadexpr_).expr_.dx_.num_elts != 0) {
    pdVar8 = (pFVar6->fadexpr_).expr_.dx_.ptr_to_data + i;
  }
  dVar1 = *pdVar8;
  dVar9 = (pFVar6->fadexpr_).expr_.val_;
  if (dVar9 < 0.0) {
    dVar9 = sqrt(dVar9);
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  dVar2 = (pFVar5->fadexpr_).left_.constant_;
  dVar10 = cos(((this->right_->fadexpr_).expr_.fadexpr_.left_)->val_ /
               (double)(this->right_->fadexpr_).expr_.fadexpr_.right_.constant_);
  pFVar7 = (this->right_->fadexpr_).expr_.fadexpr_.left_;
  pdVar8 = &pFVar7->defaultVal;
  if ((pFVar7->dx_).num_elts != 0) {
    pdVar8 = (pFVar7->dx_).ptr_to_data + i;
  }
  dVar13 = (double)(this->right_->fadexpr_).expr_.fadexpr_.right_.constant_;
  dVar3 = *pdVar8;
  dVar11 = sin(pFVar7->val_ / dVar13);
  dVar4 = (this->left_->fadexpr_).left_.constant_;
  dVar12 = (((this->left_->fadexpr_).right_)->fadexpr_).expr_.val_;
  if (dVar12 < 0.0) {
    dVar12 = sqrt(dVar12);
  }
  else {
    dVar12 = SQRT(dVar12);
  }
  return (dVar1 / (dVar9 + dVar9)) * dVar2 * dVar10 + dVar11 * (-dVar3 / dVar13) * dVar4 * dVar12;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}